

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

void __thiscall OpenMD::StuntDouble::setA(StuntDouble *this,RotMat3x3d *a,int snapshotNo)

{
  long *plVar1;
  long lVar2;
  undefined4 in_EDX;
  SquareMatrix3<double> *in_RSI;
  SquareMatrix3<double> *in_RDI;
  
  plVar1 = (long *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0];
  lVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,in_EDX);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)(lVar2 + (long)(in_RDI->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[0][2] + 0x48),
             (long)*(int *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                           data_[2]);
  SquareMatrix3<double>::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

virtual void setA(const RotMat3x3d& a, int snapshotNo) {
      ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] =
          a;
    }